

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O0

SUNErrCode SUNAdaptController_SetDefaults_Soderlind(SUNAdaptController C)

{
  SUNContext_conflict sunctx_local_scope_;
  SUNAdaptController C_local;
  
  *(undefined8 *)C->content = 0x3ff4000000000000;
  *(undefined8 *)((long)C->content + 8) = 0x3fe0000000000000;
  *(undefined8 *)((long)C->content + 0x10) = 0xbfe8000000000000;
  *(undefined8 *)((long)C->content + 0x18) = 0x3fd0000000000000;
  *(undefined1 **)((long)C->content + 0x20) = &DAT_3fe8000000000000;
  *(undefined8 *)((long)C->content + 0x28) = 0x3ff8000000000000;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_SetDefaults_Soderlind(SUNAdaptController C)
{
  SUNFunctionBegin(C->sunctx);
  SODERLIND_K1(C)   = DEFAULT_K1;
  SODERLIND_K2(C)   = DEFAULT_K2;
  SODERLIND_K3(C)   = DEFAULT_K3;
  SODERLIND_K4(C)   = DEFAULT_K4;
  SODERLIND_K5(C)   = DEFAULT_K5;
  SODERLIND_BIAS(C) = DEFAULT_BIAS;
  return SUN_SUCCESS;
}